

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O1

void __thiscall
llvm::
formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
::formatv_object(formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
                 *this,StringRef Fmt,
                tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                *Params)

{
  initializer_list<llvm::detail::format_adapter_*> __l;
  _Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false> *local_60;
  _Head_base<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_false> *local_58;
  _Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_false> *local_50;
  _Head_base<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false> *local_48;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  *local_40;
  vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_> local_38;
  allocator_type local_19;
  
  formatv_object_base::formatv_object_base(&this->super_formatv_object_base,Fmt,5);
  local_40 = &this->Parameters;
  *(undefined ***)
   &(this->Parameters).
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
    .super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<unsigned_int_&>_>.
    super__Head_base<4UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_false>._M_head_impl
       = &PTR_anchor_01098bf8;
  *(uint **)((long)&(this->Parameters).
                    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                    .
                    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                    .
                    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                    .
                    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                    .super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<unsigned_int_&>_>.
                    super__Head_base<4UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_false>
            + 8) =
       *(uint **)((long)&(Params->
                         super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                         ).
                         super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                         .
                         super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                         .
                         super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                         .
                         super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                         .
                         super__Head_base<4UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_false>
                         ._M_head_impl + 8);
  local_48 = &(this->Parameters).
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
              .
              super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
              .
              super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
              .super__Head_base<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .
  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .super__Head_base<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>._M_head_impl.
  super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_010989a8;
  *(uint *)((long)&(this->Parameters).
                   super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                   .
                   super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                   .
                   super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                   .
                   super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                   .
                   super__Head_base<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>
                   ._M_head_impl + 8) =
       (Params->
       super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
       ).
       super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
       .
       super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
       .
       super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
       .super__Head_base<3UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>.
       _M_head_impl.Item;
  local_50 = &(this->Parameters).
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
              .
              super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
              .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_false>;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_false>._M_head_impl.
  super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01098bf8;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_false>._M_head_impl.
  Item = (Params->
         super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
         ).
         super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
         .
         super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
         .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_int_&>,_false>.
         _M_head_impl.Item;
  local_58 = &(this->Parameters).
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
              .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_false>;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_false>._M_head_impl.
  super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01098c28;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_false>._M_head_impl.
  Item = (Params->
         super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
         ).
         super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
         .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_char_*&>,_false>.
         _M_head_impl.Item;
  local_60 = &(this->Parameters).
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
              .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl.
  super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01098918;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl.
  Item = (Params->
         super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
         ).super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
         _M_head_impl.Item;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_60;
  std::vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>::
  vector(&local_38,__l,&local_19);
  std::vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>::
  _M_move_assign(&(this->super_formatv_object_base).Adapters,&local_38);
  if (local_38.
      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

formatv_object(StringRef Fmt, Tuple &&Params)
      : formatv_object_base(Fmt, std::tuple_size<Tuple>::value),
        Parameters(std::move(Params)) {
    Adapters = apply_tuple(create_adapters(), Parameters);
  }